

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall Test::phase(Test *this)

{
  ostream *poVar1;
  Test *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  Phase ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->nr_phases + 1);
  std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->nr_passed_tests);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->nr_tests);
  std::operator<<(poVar1," ");
  this->nr_phases = this->nr_phases + 1;
  if (this->nr_tests == this->nr_passed_tests) {
    this->nr_passed_phases = this->nr_passed_phases + 1;
    poVar1 = std::operator<<((ostream *)&std::cout,"[PASS]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"[FAIL]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::flush();
  this->nr_tests = 0;
  this->nr_passed_tests = 0;
  return;
}

Assistant:

void phase(void) {
    // Report
    std::cout << "  Phase " << (nr_phases + 1) << ": ";
    std::cout << nr_passed_tests << "/" << nr_tests << " ";

    // Count
    ++nr_phases;
    if (nr_tests == nr_passed_tests) {
      ++nr_passed_phases;
      std::cout << "[PASS]" << std::endl;
    } else
      std::cout << "[FAIL]" << std::endl;

    std::cout.flush();

    // Reset
    nr_tests = 0;
    nr_passed_tests = 0;
  }